

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stream.hpp
# Opt level: O2

size_t __thiscall
io::basic_string_stream<char,_std::char_traits<char>_>::write_some<io::net::const_buffer>
          (basic_string_stream<char,_std::char_traits<char>_> *this,const_buffer *cb,error_code *ec)

{
  long from;
  position_type pVar1;
  long lVar2;
  size_t sVar3;
  
  std::error_code::clear(ec);
  if (cb->size_ == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 0x10) {
      pVar1 = detail::
              memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>::
              get_position(&this->
                            super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                          );
      std::__cxx11::string::insert
                ((ulong)&this->str_,(char *)pVar1.pos_,*(ulong *)((long)&cb->data_ + lVar2));
      from = *(long *)((long)&cb->size_ + lVar2);
      sVar3 = sVar3 + from;
      detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>::seek
                (&this->
                  super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                 ,from,current,ec);
    }
  }
  return sVar3;
}

Assistant:

std::size_t write_some(const ConstBufSeq& cb, std::error_code& ec)
    {
        static_assert(is_const_buffer_sequence_v<ConstBufSeq>,
                      "Argument passed to write_some() is not a ConstBufferSequence");

        ec.clear();

        if (io::buffer_size(cb) == 0) {
            return 0;
        }

        std::size_t total_bytes_written = 0;
        auto first = io::buffer_sequence_begin(cb);
        auto last = io::buffer_sequence_end(cb);

        while (first != last) {
            str_.insert(this->get_position().offset_from_start(),
                        reinterpret_cast<const char_type*>(first->data()),
                        first->size()/sizeof(char_type));
            total_bytes_written += first->size();
            this->seek(first->size(), seek_mode::current, ec);
            ++first;
        }

        return total_bytes_written;
    }